

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O3

void Omega_h::add_accept_production(Grammar *g)

{
  Production p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  pointer local_28;
  pointer piStack_20;
  pointer local_18;
  
  local_50._M_dataplus._M_p._0_4_ = find_goal_symbol(g);
  local_28 = (pointer)0x0;
  piStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  local_30._0_4_ = g->nsymbols;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&local_28,&local_50);
  std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
  push_back(&g->productions,(value_type *)local_30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ACCEPT","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&g->symbol_names,
             &local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  g->nsymbols = g->nsymbols + 1;
  if (local_28 != (pointer)0x0) {
    operator_delete(local_28,(long)local_18 - (long)local_28);
  }
  return;
}

Assistant:

void add_accept_production(Grammar& g) {
  auto goal_symbol = find_goal_symbol(g);
  Grammar::Production p;
  p.lhs = g.nsymbols;
  p.rhs = {goal_symbol};
  g.productions.push_back(p);
  g.symbol_names.push_back("ACCEPT");
  g.nsymbols++;
}